

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_bytecodeInterpreter_interpretSendWithReceiverTypeNoCopyArguments
          (sysbvm_context_t *context,sysbvm_pic_t *pic,sysbvm_tuple_t receiverType,
          sysbvm_tuple_t selector,size_t argumentCount,sysbvm_tuple_t *receiverAndArguments,
          sysbvm_bitflags_t applicationFlags)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t message;
  size_t i;
  sysbvm_tuple_t arguments;
  sysbvm_tuple_t method;
  sysbvm_tuple_t *receiverAndArguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t selector_local;
  sysbvm_tuple_t receiverType_local;
  sysbvm_pic_t *pic_local;
  sysbvm_context_t *context_local;
  
  method = (sysbvm_tuple_t)receiverAndArguments;
  receiverAndArguments_local = (sysbvm_tuple_t *)argumentCount;
  argumentCount_local = selector;
  selector_local = receiverType;
  receiverType_local = (sysbvm_tuple_t)pic;
  pic_local = (sysbvm_pic_t *)context;
  if (pic == (sysbvm_pic_t *)0x0) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecode.c:155: assertion failure: pic"
              );
  }
  arguments = 0;
  _Var1 = sysbvm_pic_lookupTypeAndSelector
                    ((sysbvm_pic_t *)receiverType_local,argumentCount_local,selector_local,
                     &arguments);
  if (!_Var1) {
    arguments = sysbvm_type_lookupSelector
                          ((sysbvm_context_t *)pic_local,selector_local,argumentCount_local);
    sysbvm_pic_addSelectorTypeAndMethod
              ((sysbvm_pic_t *)receiverType_local,argumentCount_local,selector_local,arguments);
  }
  if (arguments == 0) {
    if (argumentCount_local != pic_local[4].entries[1].selector) {
      arguments = sysbvm_type_lookupSelector
                            ((sysbvm_context_t *)pic_local,selector_local,argumentCount_local);
    }
    if (arguments == 0) {
      sysbvm_error("Message not understood");
    }
    sVar2 = sysbvm_array_create((sysbvm_context_t *)pic_local,
                                (sysbvm_tuple_t)receiverAndArguments_local);
    for (message = 0; message < receiverAndArguments_local; message = message + 1) {
      sysbvm_array_atPut(sVar2,message,*(sysbvm_tuple_t *)(method + (message + 1) * 8));
    }
    sVar2 = sysbvm_message_create
                      ((sysbvm_context_t *)pic_local,argumentCount_local,sVar2,selector_local,0);
    context_local =
         (sysbvm_context_t *)
         sysbvm_function_apply2
                   ((sysbvm_context_t *)pic_local,arguments,*(sysbvm_tuple_t *)method,sVar2);
  }
  else {
    context_local =
         (sysbvm_context_t *)
         sysbvm_bytecodeInterpreter_functionApplyNoCopyArguments
                   ((sysbvm_context_t *)pic_local,arguments,(long)receiverAndArguments_local + 1,
                    (sysbvm_tuple_t *)method,applicationFlags);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_bytecodeInterpreter_interpretSendWithReceiverTypeNoCopyArguments(sysbvm_context_t *context, sysbvm_pic_t *pic, sysbvm_tuple_t receiverType, sysbvm_tuple_t selector, size_t argumentCount, sysbvm_tuple_t *receiverAndArguments, sysbvm_bitflags_t applicationFlags)
{
    SYSBVM_ASSERT(pic);
    sysbvm_tuple_t method = SYSBVM_NULL_TUPLE;
    if(!sysbvm_pic_lookupTypeAndSelector(pic, selector, receiverType, &method))
    {
        method = sysbvm_type_lookupSelector(context, receiverType, selector);
        sysbvm_pic_addSelectorTypeAndMethod(pic, selector, receiverType, method);
    }

    if(method)
        return sysbvm_bytecodeInterpreter_functionApplyNoCopyArguments(context, method, argumentCount + 1, receiverAndArguments, applicationFlags);

    // Attempt to send doesNotUnderstand:
    if(selector != context->roots.doesNotUnderstandSelector)
        method = sysbvm_type_lookupSelector(context, receiverType, selector);
    if(!method)
        sysbvm_error("Message not understood");

    // Make the message.
    sysbvm_tuple_t arguments = sysbvm_array_create(context, argumentCount);
    for(size_t i = 0; i < argumentCount; ++i)
        sysbvm_array_atPut(arguments, i, receiverAndArguments[1 + i]);

    sysbvm_tuple_t message = sysbvm_message_create(context, selector, arguments, receiverType, SYSBVM_NULL_TUPLE);
    return sysbvm_function_apply2(context, method, receiverAndArguments[0], message);
}